

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_inter_gui.c
# Opt level: O0

char * str_escape(char *s,int size)

{
  char *pcVar1;
  int size_local;
  char *s_local;
  
  if (s == (char *)0x0) {
    s_local = (char *)0x0;
  }
  else {
    pcVar1 = get_escapebuffer(s,size);
    if (pcVar1 == (char *)0x0) {
      s_local = (char *)0x0;
    }
    else {
      s_local = pdgui_strnescape(s_escbuffer,s_esclength,s,(long)size);
    }
  }
  return s_local;
}

Assistant:

static const char* str_escape(const char*s, int size)
{
    if(!s)
        return s;
    if (!get_escapebuffer(s, size))
        return 0;
    return pdgui_strnescape(s_escbuffer, s_esclength, s, size);
}